

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_transform.h
# Opt level: O2

triplet<unsigned_char> __thiscall
charls::transform_hp3<unsigned_char>::inverse::operator()(inverse *this,int v1,int v2,int v3)

{
  char cVar1;
  int iVar2;
  
  iVar2 = v1 - (v3 + v2 >> 2);
  cVar1 = (char)iVar2;
  return (triplet<unsigned_char>)
         ((uint3)(byte)((cVar1 + (char)v3) - 0x40) |
         (uint3)((iVar2 + 0x40U & 0xff) << 8) | (uint3)(byte)((cVar1 + (char)v2) - 0x40) << 0x10);
}

Assistant:

operator()(const int v1, const int v2, const int v3) const noexcept
        {
            const int g = static_cast<int>(v1 - ((v3 + v2) >> 2) + range_ / 4);
            triplet<T> rgb;
            rgb.R = static_cast<T>(v3 + g - range_ / 2); // new R
            rgb.G = static_cast<T>(g);                   // new G
            rgb.B = static_cast<T>(v2 + g - range_ / 2); // new B
            return rgb;
        }